

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O3

bool __thiscall MockSupport::expectedCallsLeft(MockSupport *this)

{
  bool bVar1;
  uint uVar2;
  MockSupport *node;
  MockSupport *pMVar3;
  MockSupport *pMVar4;
  uint uVar5;
  
  bVar1 = MockExpectedCallsList::hasUnfulfilledExpectations(&this->expectations_);
  pMVar4 = (MockSupport *)&this->data_;
  node = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar4);
  if (node != (MockSupport *)0x0) {
    uVar5 = (uint)bVar1;
    do {
      pMVar3 = getMockSupport(pMVar4,(MockNamedValueListNode *)node);
      if (pMVar3 != (MockSupport *)0x0) {
        pMVar4 = getMockSupport(pMVar4,(MockNamedValueListNode *)node);
        uVar2 = (*pMVar4->_vptr_MockSupport[0x26])(pMVar4);
        uVar5 = uVar5 + (uVar2 & 0xff);
      }
      pMVar4 = node;
      node = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node);
    } while (node != (MockSupport *)0x0);
    bVar1 = uVar5 != 0;
  }
  return bVar1;
}

Assistant:

bool MockSupport::expectedCallsLeft()
{
    int callsLeft = expectations_.hasUnfulfilledExpectations();

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p)) callsLeft += getMockSupport(p)->expectedCallsLeft();

    return callsLeft != 0;
}